

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O0

int lws_broadcast(lws_context_per_thread *pt,int reason,void *in,size_t len)

{
  lws *__s;
  int iVar1;
  lws_vhost *local_48;
  lws_protocols *p;
  int ret;
  int n;
  lws_a *plwsa;
  lws_vhost *v;
  size_t len_local;
  void *in_local;
  int reason_local;
  lws_context_per_thread *pt_local;
  
  plwsa = (lws_a *)pt->context->vhost_list;
  __s = pt->fake_wsi;
  p._0_4_ = 0;
  memset(__s,0,0x20);
  (__s->a).context = pt->context;
  for (; plwsa != (lws_a *)0x0; plwsa = (lws_a *)plwsa[0xf].vhost) {
    local_48 = plwsa[0x12].vhost;
    (__s->a).vhost = (lws_vhost *)plwsa;
    for (p._4_4_ = 0; p._4_4_ < *(int *)&plwsa[0x1a].context; p._4_4_ = p._4_4_ + 1) {
      (__s->a).protocol = (lws_protocols *)local_48;
      if (*(lws_callback_function **)((long)local_48->proxy_basic_auth_token + 8) !=
          (lws_callback_function *)0x0) {
        iVar1 = (**(lws_callback_function **)((long)local_48->proxy_basic_auth_token + 8))
                          (__s,reason,(void *)0x0,in,len);
        if (iVar1 != 0) {
          p._0_4_ = 1;
        }
      }
      local_48 = (lws_vhost *)((long)local_48->proxy_basic_auth_token + 0x38);
    }
  }
  return (int)p;
}

Assistant:

int
lws_broadcast(struct lws_context_per_thread *pt, int reason, void *in, size_t len)
{
	struct lws_vhost *v = pt->context->vhost_list;
	lws_fakewsi_def_plwsa(pt);
	int n, ret = 0;

	lws_fakewsi_prep_plwsa_ctx(pt->context);
#if !defined(LWS_PLAT_FREERTOS) && LWS_MAX_SMP > 1
	((struct lws *)plwsa)->tsi = (char)(int)(pt - &pt->context->pt[0]);
#endif

	while (v) {
		const struct lws_protocols *p = v->protocols;

		plwsa->vhost = v; /* not a real bound wsi */

		for (n = 0; n < v->count_protocols; n++) {
			plwsa->protocol = p;
			if (p->callback &&
			    p->callback((struct lws *)plwsa, (enum lws_callback_reasons)reason, NULL, in, len))
				ret |= 1;
			p++;
		}

		v = v->vhost_next;
	}

	return ret;
}